

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.H
# Opt level: O3

bool amrex::operator==(BATransformer *a,BATransformer *b)

{
  BATType BVar1;
  BATType BVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  IntVect IVar6;
  IntVect IVar7;
  
  BVar1 = a->m_bat_type;
  BVar2 = b->m_bat_type;
  if (BVar2 == bndryReg || BVar1 == bndryReg) {
    if (BVar1 == bndryReg && BVar2 == bndryReg) {
      bVar3 = operator==(&(a->m_op).m_bndryReg,&(b->m_op).m_bndryReg);
      return bVar3;
    }
  }
  else {
    uVar4 = 0;
    switch(BVar1) {
    case null:
    case coarsenRatio:
      break;
    case indexType:
    case indexType_coarsenRatio:
      uVar4 = (a->m_op).m_indexType.m_typ.itype;
      break;
    default:
      uVar4 = (a->m_op).m_bndryReg.m_typ.itype;
    }
    uVar5 = 0;
    switch(BVar2) {
    case null:
    case coarsenRatio:
      break;
    case indexType:
    case indexType_coarsenRatio:
      uVar5 = (b->m_op).m_indexType.m_typ.itype;
      break;
    default:
      uVar5 = (b->m_op).m_bndryReg.m_typ.itype;
    }
    if (uVar5 == uVar4) {
      IVar6 = BATransformer::coarsen_ratio(a);
      IVar7 = BATransformer::coarsen_ratio(b);
      if (IVar6.vect[0] == IVar7.vect[0]) {
        return IVar6.vect[2] == IVar7.vect[2] && (IVar7.vect._0_8_ ^ IVar6.vect._0_8_) >> 0x20 == 0;
      }
    }
  }
  return false;
}

Assistant:

bool operator== (BATransformer const& a, BATransformer const& b) noexcept {
        if (a.m_bat_type != BATType::bndryReg && b.m_bat_type != BATType::bndryReg) {
            return a.index_type() == b.index_type()
                && a.coarsen_ratio() == b.coarsen_ratio();
        } else if (a.m_bat_type == BATType::bndryReg && b.m_bat_type == BATType::bndryReg) {
            return a.m_op.m_bndryReg == b.m_op.m_bndryReg;
        } else {
            return false;
        }
    }